

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void read_bytes<unsigned_long,unsigned_int>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *vec,size_t n_els,istream *in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  pointer pcVar1;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(vec,n_els);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_shrink_to_fit(vec);
  if (n_els == 0) {
    return;
  }
  pcVar1 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((ulong)((long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar1) < n_els * 4) {
    std::vector<char,_std::allocator<char>_>::resize(buffer,n_els * 8);
    pcVar1 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  std::istream::read((char *)in,(long)pcVar1);
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 1) == 0) {
    if (diff_endian) {
      swap_endianness<unsigned_int>
                ((uint *)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_start,n_els);
    }
    convert_dtype<unsigned_long,unsigned_int>
              ((vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start,buffer,n_els);
    return;
  }
  throw_errno();
}

Assistant:

void read_bytes(std::vector<dtype> &vec, const size_t n_els, std::istream &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (std::is_same<dtype, saved_type>::value)
    {
        read_bytes<dtype>(vec, n_els, in);
        if (unlikely(diff_endian)) swap_endianness(vec.data(), n_els);
        return;
    }
    vec.resize(n_els);
    vec.shrink_to_fit();

    if (n_els) {
        if (unlikely(buffer.size() < n_els * sizeof(saved_type)))
            buffer.resize((size_t)2 * n_els * sizeof(saved_type));
        in.read(buffer.data(), n_els * sizeof(saved_type));
        if (unlikely(in.bad())) throw_errno();

        if (unlikely(diff_endian)) swap_endianness((saved_type*)buffer.data(), n_els);
        convert_dtype<dtype, saved_type>(vec.data(), buffer, n_els);
    }
}